

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecPeformDec2(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Sfm_Par_t *pSVar1;
  word wVar2;
  word wVar3;
  bool bVar4;
  Vec_Int_t *vCut;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  word *pwVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  word wVar16;
  ulong uVar17;
  ulong uVar18;
  word (*pTruth) [4];
  long lVar19;
  int (*pSupp_00) [16];
  int local_1224;
  uint local_1220;
  int local_121c;
  int iLibObj;
  word *local_1208;
  Vec_Int_t *local_1200;
  Vec_Int_t *local_11f8;
  ulong local_11f0;
  int nSupp [4];
  word Masks [2] [8];
  word uTruth [4] [4];
  int pSupp [4] [16];
  int pAssump [1000];
  
  pSVar1 = p->pPars;
  if (pSVar1->fPrintDecs == 0) {
    if (pSVar1->fArea != 1) goto LAB_00529254;
    uVar5 = pSVar1->nDecMax;
    uVar10 = 1;
    if (1 < (int)uVar5) {
      uVar10 = uVar5;
    }
    if (pSVar1->fVeryVerbose == 0) {
      bVar4 = false;
      goto LAB_00528d66;
    }
  }
  else {
    uVar10 = 1;
    if (1 < pSVar1->nDecMax) {
      uVar10 = pSVar1->nDecMax;
    }
    if (pSVar1->fArea != 1) {
LAB_00529254:
      __assert_fail("p->pPars->fArea == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x454,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
    }
  }
  printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  uVar5 = p->pPars->nDecMax;
  bVar4 = true;
LAB_00528d66:
  if (4 < (int)uVar5) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x459,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  local_1208 = p->Copy;
  local_11f8 = &p->vObjMap;
  local_1200 = &p->vGateCut;
  local_11f0 = (ulong)uVar10;
  local_1224 = -1;
  uVar18 = 0;
  local_121c = -1;
  local_1220 = 0xffffffff;
  iVar11 = 0;
  do {
    iVar6 = (p->vObjDec).nSize;
    if (iVar11 < iVar6) {
      (p->vObjDec).nSize = iVar11;
      iVar6 = iVar11;
    }
    uVar5 = p->nPats[0];
    uVar8 = (ulong)uVar5;
    if (0x200 < uVar8) {
LAB_005291f7:
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    pTruth = uTruth + uVar18;
    iVar11 = iVar6 + 1;
    pwVar12 = Masks[0];
    uVar14 = 0;
    uVar17 = uVar8;
    do {
      uVar13 = uVar14 + 0x40;
      uVar15 = 0xffffffffffffffff;
      if (uVar8 < uVar13) {
        if (uVar14 < uVar8) {
          if (0x40 < uVar17) goto LAB_005291d8;
          uVar15 = 0xffffffffffffffff >> (0x40U - (char)uVar5 & 0x3f);
        }
        else {
          uVar15 = 0;
        }
      }
      *pwVar12 = uVar15;
      uVar17 = uVar17 - 0x40;
      pwVar12 = pwVar12 + 1;
      uVar14 = uVar13;
    } while (uVar13 != 0x200);
    uVar5 = p->nPats[1];
    uVar8 = (ulong)uVar5;
    if (0x200 < uVar8) goto LAB_005291f7;
    pwVar12 = Masks[1];
    uVar14 = 0;
    uVar17 = uVar8;
    do {
      uVar13 = uVar14 + 0x40;
      wVar16 = 0xffffffffffffffff;
      if (uVar8 < uVar13) {
        if (uVar14 < uVar8) {
          if (0x40 < uVar17) {
LAB_005291d8:
            __assert_fail("nBits >= 0 && nBits <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0xc2,"word Abc_Tt6Mask(int)");
          }
          wVar16 = 0xffffffffffffffff >> (0x40U - (char)uVar5 & 0x3f);
        }
        else {
          wVar16 = 0;
        }
      }
      *pwVar12 = wVar16;
      uVar17 = uVar17 - 0x40;
      pwVar12 = pwVar12 + 1;
      uVar14 = uVar13;
    } while (uVar13 != 0x200);
    pSupp_00 = pSupp + uVar18;
    iVar6 = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[uVar18] = iVar6;
    if (iVar6 == -2) {
      if (bVar4) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",uVar18 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar4) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",uVar18 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,iVar6);
      }
      p->nSuppVars = iVar6;
      if (iVar6 < 2) {
        wVar16 = (*pTruth)[0];
        wVar2 = uTruth[uVar18][1];
        wVar3 = uTruth[uVar18][3];
        local_1208[2] = uTruth[uVar18][2];
        local_1208[3] = wVar3;
        *local_1208 = wVar16;
        local_1208[1] = wVar2;
        iVar11 = Sfm_LibImplementSimple
                           (p->pLib,*pTruth,*pSupp_00,iVar6,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < iVar6) {
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x475,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[iVar6] = p->nLuckySizes[iVar6] + 1;
        if (2 < iVar11) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x477,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        piVar9 = p->nLuckyGates + iVar11;
        goto LAB_005291b7;
      }
      wVar16 = (*pTruth)[0];
      wVar2 = uTruth[uVar18][1];
      wVar3 = uTruth[uVar18][3];
      local_1208[2] = uTruth[uVar18][2];
      local_1208[3] = wVar3;
      *local_1208 = wVar16;
      local_1208[1] = wVar2;
      iVar7 = Sfm_LibFindAreaMatch(p->pLib,*pTruth,iVar6,&iLibObj);
      vCut = local_1200;
      if (iVar7 != -1) {
        Sfm_DecPrepareVec(local_11f8,*pSupp_00,iVar6,local_1200);
        iVar6 = Sfm_DecMffcAreaReal(pObj,vCut,(Vec_Int_t *)0x0);
        if (iVar6 < p->AreaMffc) {
          __assert_fail("p->AreaMffc <= AreaThis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x492,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        if (p->pPars->fZeroCost == 0) {
          if (iVar7 < iVar6) goto LAB_00529028;
        }
        else if (iVar7 <= iVar6) {
LAB_00529028:
          iVar6 = iVar6 - iVar7;
          if (iVar6 < 0) {
            __assert_fail("GainThis >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                          ,0x497,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          if (local_121c < iVar6) {
            local_1224 = iLibObj;
            local_1220 = (uint)uVar18;
            local_121c = iVar6;
          }
        }
      }
    }
    uVar18 = uVar18 + 1;
    if (uVar18 == local_11f0) {
      Sfm_ObjSetdownSimInfo((Abc_Obj_t *)pObj->pNtk->pData);
      if (local_1220 == 0xffffffff) {
        if (bVar4) {
          puts("Best  : NO DEC.");
        }
        piVar9 = &p->nNoDecs;
        iVar11 = -2;
      }
      else {
        lVar19 = (long)(int)local_1220;
        if (bVar4) {
          uVar5 = nSupp[lVar19];
          printf("Best %d: %d  ",(ulong)local_1220,(ulong)uVar5);
          Dau_DsdPrintFromTruth(uTruth[lVar19],uVar5);
        }
        if (local_1224 < 0) {
          __assert_fail("iLibObjBest >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4ad,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        iVar11 = nSupp[lVar19];
        iVar6 = Sfm_LibImplementGatesArea
                          (p->pLib,pSupp[lVar19],iVar11,local_1224,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < iVar11) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4af,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[iVar11] = p->nLuckySizes[iVar11] + 1;
        if (2 < iVar6) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4b1,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        piVar9 = p->nLuckyGates + iVar6;
        iVar11 = 1;
      }
LAB_005291b7:
      *piVar9 = *piVar9 + 1;
      return iVar11;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec2( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    //int fNeedInv, AreaGainInv = Sfm_DecComputeFlipInvGain(p, pObj, &fNeedInv);
    int i, RetValue, Prev = 0, iBest = -1, AreaThis, AreaNew;//, AreaNewInv;
    int GainThis, GainBest = -1, iLibObj, iLibObjBest = -1; 
    assert( p->pPars->fArea == 1 );
//printf( "AreaGainInv = %8.2f  ", Scl_Int2Flt(AreaGainInv) );
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            //printf( "\n" );
            return RetValue;
        }

        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        AreaNew = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], &iLibObj );
/*
        uTruth[i][0] = ~uTruth[i][0];
        AreaNewInv = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], NULL );
        uTruth[i][0] = ~uTruth[i][0];

        if ( AreaNew > 0 && AreaNewInv > 0 && AreaNew - AreaNewInv + AreaGainInv > 0 )
            printf( "AreaNew = %8.2f   AreaNewInv = %8.2f   Gain = %8.2f   Total = %8.2f\n", 
                Scl_Int2Flt(AreaNew), Scl_Int2Flt(AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv + AreaGainInv) );
        else
            printf( "\n" );
*/
        if ( AreaNew == -1 )
            continue;


        // compute area savings
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut );
        AreaThis = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, NULL);
        assert( p->AreaMffc <= AreaThis );
        if ( p->pPars->fZeroCost ? (AreaNew > AreaThis) : (AreaNew >= AreaThis) )
            continue;
        // find the best gain
        GainThis = AreaThis - AreaNew;
        assert( GainThis >= 0 );
        if ( GainBest < GainThis )
        {
            GainBest    = GainThis;
            iLibObjBest = iLibObj;
            iBest       = i;
        }
    }
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        //printf( "\n" );
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
    if ( fVeryVerbose )
      Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    // implement
    assert( iLibObjBest >= 0 );
    RetValue = Sfm_LibImplementGatesArea( p->pLib, pSupp[iBest], nSupp[iBest], iLibObjBest, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    return 1;
}